

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O0

int av1_block_wavelet_energy_level(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs)

{
  int iVar1;
  AV1_COMP *in_RDI;
  double dVar2;
  double energy_midpoint;
  double energy;
  BLOCK_SIZE in_stack_ffffffffffffffcf;
  MACROBLOCK *x_00;
  
  iVar1 = is_stat_consumption_stage_twopass(in_RDI);
  if (iVar1 == 0) {
    x_00 = (MACROBLOCK *)0x4024000000000000;
  }
  else {
    x_00 = (MACROBLOCK *)(in_RDI->twopass_frame).frame_avg_haar_energy;
  }
  dVar2 = log_block_wavelet_energy(x_00,in_stack_ffffffffffffffcf);
  dVar2 = round(dVar2 - (double)x_00);
  iVar1 = clamp((int)dVar2,-4,1);
  return iVar1;
}

Assistant:

int av1_block_wavelet_energy_level(const AV1_COMP *cpi, const MACROBLOCK *x,
                                   BLOCK_SIZE bs) {
  double energy, energy_midpoint;
  energy_midpoint = (is_stat_consumption_stage_twopass(cpi))
                        ? cpi->twopass_frame.frame_avg_haar_energy
                        : DEFAULT_E_MIDPOINT;
  energy = log_block_wavelet_energy(x, bs) - energy_midpoint;
  return clamp((int)round(energy), ENERGY_MIN, ENERGY_MAX);
}